

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMockerBase<void_(unsigned_short,_unsigned_short)>::InvokeWith
          (FunctionMockerBase<void_(unsigned_short,_unsigned_short)> *this,type args)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<void> *pAVar1;
  scoped_ptr<testing::internal::ActionResultHolder<void>_> local_28;
  scoped_ptr<testing::internal::ActionResultHolder<void>_> holder;
  void *untyped_args;
  type args_local;
  FunctionMockerBase<void_(unsigned_short,_unsigned_short)> *this_local;
  
  holder.ptr_ = (ActionResultHolder<void> *)args;
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,args);
  pAVar1 = DownCast_<testing::internal::ActionResultHolder<void>*,testing::internal::UntypedActionResultHolderBase>
                     (f);
  scoped_ptr<testing::internal::ActionResultHolder<void>_>::scoped_ptr(&local_28,pAVar1);
  pAVar1 = scoped_ptr<testing::internal::ActionResultHolder<void>_>::operator->(&local_28);
  ActionResultHolder<void>::Unwrap(pAVar1);
  scoped_ptr<testing::internal::ActionResultHolder<void>_>::~scoped_ptr(&local_28);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    // const_cast is required since in C++98 we still pass ArgumentTuple around
    // by const& instead of rvalue reference.
    void* untyped_args = const_cast<void*>(static_cast<const void*>(&args));
    scoped_ptr<ResultHolder> holder(
        DownCast_<ResultHolder*>(this->UntypedInvokeWith(untyped_args)));
    return holder->Unwrap();
  }